

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.hpp
# Opt level: O3

void * __thiscall
Lib::
SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::SListIntermediateNode::NodePtrComparator>
::insertPositionRaw<Kernel::TermList::Top>
          (SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::SListIntermediateNode::NodePtrComparator>
           *this,Top key)

{
  Node *pNVar1;
  Node *pNVar2;
  result_type_conflict1 rVar3;
  ResultOf<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:647:37),_Constant<0>_>
  RVar4;
  Node *pNVar5;
  uint uVar6;
  byte bVar7;
  ulong uVar8;
  uint uVar9;
  Node *pNVar10;
  anon_class_16_2_441c8d4f f;
  Top TVar11;
  Coproduct<Kernel::VarNumber,_Kernel::SymbolId> local_50;
  undefined8 local_40;
  char local_38;
  
  local_40 = key._inner._inner._0_8_;
  local_38 = key._inner._inner._content[7];
  uVar6 = 0xffffffff;
  do {
    local_50._inner._0_1_ = 0;
    local_50._inner._content[0] = '\0';
    local_50._inner._content[1] = '\0';
    local_50._inner._content[2] = '\0';
    local_50._inner._content[3] = '\x01';
    local_50._inner._content[4] = '\0';
    local_50._inner._content[5] = '\0';
    local_50._inner._content[6] = '\0';
    rVar3 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)&local_50,&Random::_eng,
                       (param_type *)&local_50);
    uVar6 = uVar6 + 1;
  } while (rVar3 != 0);
  uVar9 = this->_top;
  if (uVar9 <= uVar6) {
    if (uVar9 < 0x20) {
      this->_top = uVar9 + 1;
      uVar6 = uVar9;
    }
    else {
      uVar6 = uVar9 - 1;
    }
  }
  uVar8 = (ulong)uVar6 * 8 + 0x1f & 0xffffffff0;
  if (uVar8 == 0) {
    pNVar5 = (Node *)FixedSizeAllocator<8UL>::alloc
                               ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
  }
  else if (uVar8 < 0x11) {
    pNVar5 = (Node *)FixedSizeAllocator<16UL>::alloc
                               ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
  }
  else if (uVar8 < 0x19) {
    pNVar5 = (Node *)FixedSizeAllocator<24UL>::alloc
                               ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
  }
  else if (uVar8 < 0x21) {
    pNVar5 = (Node *)FixedSizeAllocator<32UL>::alloc
                               ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
  }
  else if (uVar8 < 0x31) {
    pNVar5 = (Node *)FixedSizeAllocator<48UL>::alloc
                               ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
  }
  else if (uVar8 < 0x41) {
    pNVar5 = (Node *)FixedSizeAllocator<64UL>::alloc
                               ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  }
  else {
    pNVar5 = (Node *)::operator_new(uVar8,0x10);
  }
  uVar8 = (ulong)this->_top;
  pNVar10 = this->_left;
LAB_0032e3da:
  do {
    uVar9 = (int)uVar8 - 1;
    uVar8 = (ulong)uVar9;
    pNVar2 = pNVar10;
    do {
      pNVar10 = pNVar2;
      pNVar1 = pNVar10->nodes[uVar8];
      if (pNVar1 == (Node *)0x0) {
        if (uVar6 < uVar9) goto LAB_0032e3da;
        pNVar10->nodes[uVar8] = pNVar5;
        pNVar5->nodes[uVar8] = (Node *)0x0;
        goto LAB_0032e46d;
      }
      TVar11 = Kernel::TermList::top(&pNVar1->value->_term);
      local_50._inner._0_8_ = TVar11._inner._inner._0_8_;
      bVar7 = TVar11._inner._inner._0_1_ & 1;
      local_50._inner._content[7] = TVar11._inner._inner._content[7];
      if (((byte)local_40._0_1_ & 1) == bVar7) {
        f.rhs = &local_50;
        f.lhs = (Coproduct<Kernel::VarNumber,_Kernel::SymbolId> *)&local_40;
        RVar4 = CoproductImpl::RawCoproduct<Kernel::VarNumber,Kernel::SymbolId>::operator()
                          ((RawCoproduct<Kernel::VarNumber,Kernel::SymbolId> *)&local_40,f);
      }
      else {
        RVar4 = -(uint)(((byte)local_40._0_1_ & 1) < bVar7) | GREATER;
      }
      pNVar2 = pNVar1;
    } while (((uint)RVar4 < 2) || (pNVar2 = pNVar10, RVar4 != LESS));
    if (uVar9 <= uVar6) {
      pNVar5->nodes[uVar8] = pNVar1;
      pNVar10->nodes[uVar8] = pNVar5;
LAB_0032e46d:
      if (uVar8 == 0) {
        return pNVar5;
      }
    }
  } while( true );
}

Assistant:

void* insertPositionRaw(Key key)
  {
    // select a random height between 0 and top
    unsigned nodeHeight = 0;
    while (Random::getBit()) {
      nodeHeight++;
    }
    if (nodeHeight >= _top) {
      if (_top < SKIP_LIST_MAX_HEIGHT) {
	nodeHeight = _top;
	_top++;
      }
      else {
	ASS(_top == SKIP_LIST_MAX_HEIGHT);
	nodeHeight = _top - 1;
      }
    }
    Node* newNode = allocate(nodeHeight);


    unsigned h = _top - 1;


    // left is a node with a value smaller than that of newNode and having
    // a large enough height.
    // this node is on the left of the inserted one
    Node* left = _left;
    for (;;) {
      Node* next = left->nodes[h];
      if (next == 0) {
	if(h<=nodeHeight) {
	  left->nodes[h] = newNode;
	  newNode->nodes[h] = 0;
	  if (h == 0) {
	    return &newNode->value;
	  }
	}
	h--;
	continue;
      }
      // next != 0
      switch (ValueComparator::compare(key,next->value))
	{
	case LESS:
	  // the node should be inserted on the left
	  if(h<=nodeHeight) {
	    newNode->nodes[h] = next;
	    left->nodes[h] = newNode;
	    if (h == 0) {
	      return &newNode->value;
	    }
	  }
	  h--;
	  break;

	case EQUAL: //we insert equal elements next to each other
	case GREATER:
	  left = next;
	  break;

#if VDEBUG
	default:
	  ASSERTION_VIOLATION;
#endif
	}
    }
  }